

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O3

void __thiscall QToolBar::paintEvent(QToolBar *this,QPaintEvent *param_1)

{
  QStyle *pQVar1;
  long lVar2;
  QPalette *pQVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  QPainter p;
  undefined1 local_90 [8];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  local_90 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_90,&(this->super_QWidget).super_QPaintDevice);
  pQVar1 = QWidget::style(&this->super_QWidget);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_88);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionToolBar *)local_88);
  lVar2 = *(long *)(lVar2 + 0x278);
  if (((*(char *)(lVar2 + 0x1c) == '\0') && (*(char *)(lVar2 + 0x1d) == '\0')) &&
     (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
    uVar4 = 0x28;
    lVar2 = 0xb8;
  }
  else {
    pQVar3 = QWidget::palette(&this->super_QWidget);
    QPalette::brush((ColorGroup)pQVar3,Dark);
    QPainter::fillRect((QRect *)local_90,(QBrush *)local_78);
    (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,0x28,local_88,(QRect *)local_90,this);
    uVar4 = 6;
    lVar2 = 0xb0;
  }
  (**(code **)(*(long *)pQVar1 + lVar2))(pQVar1,uVar4,local_88,local_90,this);
  local_78 = (**(code **)(*(long *)pQVar1 + 0xc0))(pQVar1,0x34,local_88,this);
  if ((local_78._0_4_ <= local_78._8_4_) && (local_78._4_4_ <= local_78._12_4_)) {
    (**(code **)(*(long *)pQVar1 + 0xb0))(pQVar1,0x24,local_88,local_90,this);
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_88);
  QPainter::~QPainter((QPainter *)local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::paintEvent(QPaintEvent *)
{
    Q_D(QToolBar);

    QPainter p(this);
    QStyle *style = this->style();
    QStyleOptionToolBar opt;
    initStyleOption(&opt);

    if (d->layout->expanded || d->layout->animating || isWindow()) {
        //if the toolbar is expended, we need to fill the background with the window color
        //because some styles may expects that.
        p.fillRect(opt.rect, palette().window());
        style->drawControl(QStyle::CE_ToolBar, &opt, &p, this);
        style->drawPrimitive(QStyle::PE_FrameMenu, &opt, &p, this);
    } else {
        style->drawControl(QStyle::CE_ToolBar, &opt, &p, this);
    }

    opt.rect = style->subElementRect(QStyle::SE_ToolBarHandle, &opt, this);
    if (opt.rect.isValid())
        style->drawPrimitive(QStyle::PE_IndicatorToolBarHandle, &opt, &p, this);
}